

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O1

ze_result_t
loader::zePhysicalMemCreate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_physical_mem_desc_t *desc,
          ze_physical_mem_handle_t *phPhysicalMemory)

{
  ze_pfnPhysicalMemCreate_t p_Var1;
  ze_result_t zVar2;
  object_t<_ze_physical_mem_handle_t_*> *poVar3;
  dditable_t *dditable;
  dditable_t *local_10;
  
  local_10 = *(dditable_t **)(hContext + 8);
  p_Var1 = (local_10->ze).PhysicalMem.pfnCreate;
  if (p_Var1 == (ze_pfnPhysicalMemCreate_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    zVar2 = (*p_Var1)(*(ze_context_handle_t *)hContext,*(ze_device_handle_t *)hDevice,desc,
                      phPhysicalMemory);
    if (zVar2 == ZE_RESULT_SUCCESS) {
      poVar3 = singleton_factory_t<object_t<_ze_physical_mem_handle_t*>,_ze_physical_mem_handle_t*>
               ::getInstance<_ze_physical_mem_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_physical_mem_handle_t*>,_ze_physical_mem_handle_t*>
                           *)(context + 0x5a0),phPhysicalMemory,&local_10);
      *phPhysicalMemory = (ze_physical_mem_handle_t)poVar3;
      zVar2 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zePhysicalMemCreate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object, can be `nullptr` if creating
                                                        ///< physical host memory.
        ze_physical_mem_desc_t* desc,                   ///< [in] pointer to physical memory descriptor.
        ze_physical_mem_handle_t* phPhysicalMemory      ///< [out] pointer to handle of physical memory object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_context_object_t*>( hContext )->dditable;
        auto pfnCreate = dditable->ze.PhysicalMem.pfnCreate;
        if( nullptr == pfnCreate )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<ze_context_object_t*>( hContext )->handle;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<ze_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnCreate( hContext, hDevice, desc, phPhysicalMemory );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phPhysicalMemory = reinterpret_cast<ze_physical_mem_handle_t>(
                context->ze_physical_mem_factory.getInstance( *phPhysicalMemory, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }